

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O3

void freenode(astnode *ptr)

{
  uint uVar1;
  int iVar2;
  
  if (ptr == (astnode *)0x0) {
    return;
  }
  iVar2 = ptr->type;
  if (iVar2 < 0x125) {
    uVar1 = iVar2 - 0x21;
    if (uVar1 < 0x3e) {
      if ((0x2000000028005630U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001052eb;
      if ((ulong)uVar1 == 0) goto LAB_001052f4;
    }
    if (iVar2 == 0x7c) {
LAB_001052eb:
      freenode((astnode *)ptr->right);
    }
    else if (iVar2 != 0x7e) goto LAB_00105315;
LAB_001052f4:
    freenode((astnode *)ptr->left);
  }
  else {
    uVar1 = iVar2 - 0x125;
    if (uVar1 < 0x27) {
      if ((0x8000ff0UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001052eb;
      if ((0x4010000001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001052f4;
    }
    if (iVar2 != 0x170) {
LAB_00105315:
      yyerror("Warning: Unknown expression type in free");
      return;
    }
  }
  free(ptr);
  return;
}

Assistant:

void freenode(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case STATEMENT:
		
		case LOR:
		case LAND:
		case '|':
		case '^':
		case '&':
		case EQ:
		case NE:	
		case '>':
		case '<':
		case GE:	
		case LE:
		case SHL:
		case SHR:
		case '+':
		case '-':
		case '*':
		case '/':
		case '%':
			freenode(ptr->right);
			
		case COMPOUND:
		case RETURN: 
			
		case NEGATE:
		case '~':
		case '!':
			freenode(ptr->left);
			
		case ICONSTANT:
			free(ptr);
			break;
			
		default:
			yyerror("Warning: Unknown expression type in free");
			break;
		
	}
	
	return;
	
}